

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::initialSyncProject
          (Projection *this,int c_lev,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *sig,Real dt,Real strt_time,
          int have_divu)

{
  bool bVar1;
  int iVar2;
  MultiFab *pMVar3;
  MultiFab **ppMVar4;
  FArrayBox *pFVar5;
  AmrLevel **ppAVar6;
  Geometry *this_00;
  type mf;
  FabFactory<amrex::FArrayBox> *i;
  int in_ECX;
  int in_ESI;
  Projection *in_RDI;
  uint uVar7;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  Real run_time;
  int IOProc;
  MultiFab *P_new;
  bool increment_gp;
  NavierStokesBase *ns_1;
  MultiFab v_fine;
  MultiFab v_crse;
  DistributionMapping *fine_dmap;
  DistributionMapping *crse_dmap;
  BoxArray *fine_grids;
  BoxArray *crse_grids;
  MultiFab *u_o_1;
  MFIter mfi_2;
  Real curr_time_1;
  Real prev_time_1;
  MultiFab *S_new;
  MultiFab *S_old;
  MultiFab *u_o;
  Array4<double> *rhcc_arr;
  Array4<double> *dsdt_arr;
  Array4<double> *du;
  Box *bx;
  MFIter mfi_1;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> dsdt;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> divu;
  NavierStokesBase *ns;
  MultiFab *rhcclev;
  int nghost;
  MFIter mfi;
  Real curr_time;
  Real prev_time;
  MultiFab *divu_old;
  MultiFab *divu_new;
  int Divu;
  int Divu_Type;
  AmrLevel *amr_level;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  Real dt_inv;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  Real stime;
  int f_lev;
  int lev;
  MFIter *in_stack_fffffffffffff268;
  Real *x;
  Amr *in_stack_fffffffffffff270;
  AmrLevel *pAVar8;
  int in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff27c;
  NavierStokesBase *in_stack_fffffffffffff280;
  string *in_stack_fffffffffffff288;
  int in_stack_fffffffffffff290;
  int in_stack_fffffffffffff294;
  FabArrayBase *in_stack_fffffffffffff298;
  Print *in_stack_fffffffffffff2a0;
  BoxArray *in_stack_fffffffffffff2a8;
  anon_class_200_4_c736ae0a *in_stack_fffffffffffff2b0;
  undefined4 in_stack_fffffffffffff2b8;
  undefined4 in_stack_fffffffffffff2bc;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff2c0;
  undefined8 in_stack_fffffffffffff2d8;
  Print *in_stack_fffffffffffff2e0;
  undefined8 in_stack_fffffffffffff2e8;
  NavierStokesBase *in_stack_fffffffffffff2f0;
  undefined8 in_stack_fffffffffffff300;
  value_type in_stack_fffffffffffff308;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff310;
  BoxArray *in_stack_fffffffffffff320;
  Real in_stack_fffffffffffff328;
  undefined4 in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff334;
  int iVar9;
  MultiFab *in_stack_fffffffffffff338;
  Projection *in_stack_fffffffffffff340;
  undefined8 in_stack_fffffffffffff3b0;
  AmrLevel *in_stack_fffffffffffff3b8;
  BoxArray *in_stack_fffffffffffff3c0;
  MultiFab *in_stack_fffffffffffff3c8;
  Projection *in_stack_fffffffffffff3d0;
  double local_a00;
  int local_9f4;
  MultiFab *local_9f0;
  _func_int **local_9e8;
  undefined8 uStack_9e0;
  CoordSys local_9d8 [5];
  int local_7f8 [29];
  undefined1 in_stack_fffffffffffff87e;
  undefined1 in_stack_fffffffffffff87f;
  Real in_stack_fffffffffffff880;
  Real in_stack_fffffffffffff888;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff890;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff898;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  Projection *in_stack_fffffffffffff8b0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff950;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff958;
  MultiFab *in_stack_fffffffffffff968;
  MultiFab *in_stack_fffffffffffff970;
  MFIter local_610;
  Real local_5b0;
  Real local_5a8;
  MultiFab *local_5a0;
  MultiFab *local_598;
  MultiFab *local_590;
  undefined1 local_588 [64];
  undefined1 auStack_548 [64];
  undefined1 auStack_508 [64];
  double local_4c8;
  undefined1 local_4c0 [64];
  undefined1 *local_480;
  undefined1 local_478 [64];
  undefined1 *local_438;
  undefined1 local_430 [64];
  undefined1 *local_3f0;
  undefined1 local_3e4 [28];
  undefined1 *local_3c8;
  MFIter local_3c0;
  undefined8 local_350;
  pointer local_348;
  undefined1 local_339;
  undefined1 local_338 [144];
  Real local_2a8;
  Real local_2a0;
  MultiFab *local_298;
  MultiFab *local_290;
  allocator local_281;
  string local_280 [36];
  uint local_25c;
  AmrLevel *local_258;
  double local_238;
  undefined8 local_228;
  undefined8 local_200;
  double local_1e0;
  undefined1 local_1d5;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffea8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffeb0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffeb8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  Projection *in_stack_fffffffffffffed0;
  int local_38;
  
  iVar2 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI->parent);
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff2a0,(ostream *)in_stack_fffffffffffff298);
    amrex::Print::operator<<
              ((Print *)in_stack_fffffffffffff270,(char (*) [44])in_stack_fffffffffffff268);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff270,(int *)in_stack_fffffffffffff268);
    amrex::Print::operator<<
              ((Print *)in_stack_fffffffffffff270,(char (*) [4])in_stack_fffffffffffff268);
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff270,(int *)in_stack_fffffffffffff268);
    local_1d5 = 10;
    amrex::Print::operator<<((Print *)in_stack_fffffffffffff270,(char *)in_stack_fffffffffffff268);
    amrex::Print::~Print(in_stack_fffffffffffff2e0);
  }
  if ((verbose != 0) && (((anonymous_namespace)::benchmarking & 1) != 0)) {
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  local_1e0 = amrex::ParallelDescriptor::second();
  local_200 = 0;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x831613);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff280,CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278)
             ,(value_type *)in_stack_fffffffffffff270,(allocator_type *)in_stack_fffffffffffff268);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x831644);
  local_228 = 0;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x831665);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_fffffffffffff280,CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278)
             ,(value_type *)in_stack_fffffffffffff270,(allocator_type *)in_stack_fffffffffffff268);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x831696);
  for (local_38 = in_ESI; local_38 <= iVar2; local_38 = local_38 + 1) {
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    pMVar3 = amrex::AmrLevel::get_new_data
                       ((AmrLevel *)in_stack_fffffffffffff270,
                        (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    *ppMVar4 = pMVar3;
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    pMVar3 = amrex::AmrLevel::get_old_data
                       ((AmrLevel *)in_stack_fffffffffffff270,
                        (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    *ppMVar4 = pMVar3;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff270,
               (value_type)in_stack_fffffffffffff268);
  }
  local_238 = 1.0 / (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::Vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            *)0x831823);
  iVar9 = in_ESI;
  if (in_ECX != 0) {
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
             (size_type)in_stack_fffffffffffff288);
    for (local_38 = in_ESI; iVar9 = in_ESI, local_38 <= iVar2; local_38 = local_38 + 1) {
      local_258 = amrex::Amr::getLevel
                            (in_stack_fffffffffffff270,
                             (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
      amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                 in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"divu",&local_281);
      bVar1 = amrex::AmrLevel::isStateVariable
                        (in_stack_fffffffffffff288,(int *)in_stack_fffffffffffff280,
                         (int *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        amrex::Error_host((char *)in_stack_fffffffffffff280);
      }
      local_290 = amrex::AmrLevel::get_new_data
                            ((AmrLevel *)in_stack_fffffffffffff270,
                             (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
      local_298 = amrex::AmrLevel::get_old_data
                            ((AmrLevel *)in_stack_fffffffffffff270,
                             (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                 SUB81((ulong)in_stack_fffffffffffff288 >> 0x38,0));
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                 SUB81((ulong)in_stack_fffffffffffff288 >> 0x38,0));
      amrex::AmrLevel::get_state_data
                ((AmrLevel *)in_stack_fffffffffffff270,
                 (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
      local_2a0 = amrex::StateData::prevTime((StateData *)in_stack_fffffffffffff280);
      amrex::AmrLevel::get_state_data
                ((AmrLevel *)in_stack_fffffffffffff270,
                 (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
      local_2a8 = amrex::StateData::curTime
                            ((StateData *)
                             CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290));
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                 (uchar)((uint)in_stack_fffffffffffff294 >> 0x18));
      while (bVar1 = amrex::MFIter::isValid((MFIter *)(local_338 + 0x30)), pAVar8 = local_258, bVar1
            ) {
        pFVar5 = amrex::FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff270,
                            in_stack_fffffffffffff268);
        (*pAVar8->_vptr_AmrLevel[0x1e])(SUB84(local_2a0,0),pAVar8,pFVar5,(ulong)local_25c,0,0,1);
        pAVar8 = local_258;
        pFVar5 = amrex::FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff270,
                            in_stack_fffffffffffff268);
        (*pAVar8->_vptr_AmrLevel[0x1e])(SUB84(local_2a8,0),pAVar8,pFVar5,(ulong)local_25c,0,0,1);
        amrex::MFIter::operator++((MFIter *)(local_338 + 0x30));
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff270);
      local_338._44_4_ = 1;
      amrex::
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
      operator_new(0x180);
      local_339 = 1;
      in_stack_fffffffffffff3c0 = amrex::AmrLevel::boxArray(local_258);
      in_stack_fffffffffffff3c8 = (MultiFab *)amrex::AmrLevel::DistributionMap(local_258);
      local_338._16_8_ = (pointer)0x0;
      local_338._24_8_ = (pointer)0x0;
      local_338._0_8_ = (Amr *)0x0;
      local_338._8_8_ = (pointer)0x0;
      local_338._32_8_ = (pointer)0x0;
      in_stack_fffffffffffff3d0 = (Projection *)local_338;
      amrex::MFInfo::MFInfo((MFInfo *)0x831c28);
      in_stack_fffffffffffff268 =
           (MFIter *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff270);
      amrex::MultiFab::MultiFab
                ((MultiFab *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
                 (DistributionMapping *)in_stack_fffffffffffff2a0,
                 (int)((ulong)in_stack_fffffffffffff298 >> 0x20),(int)in_stack_fffffffffffff298,
                 (MFInfo *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                 in_stack_fffffffffffff2c0);
      local_339 = 0;
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff270,(pointer)in_stack_fffffffffffff268);
      amrex::MFInfo::~MFInfo((MFInfo *)0x831c98);
      amrex::
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
      local_348 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                             in_stack_fffffffffffff270);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff270,
                 (value_type)in_stack_fffffffffffff268);
      in_stack_fffffffffffff3b8 =
           amrex::Amr::getLevel
                     (in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20));
      if (in_stack_fffffffffffff3b8 == (AmrLevel *)0x0) {
        in_stack_fffffffffffff3b0 = 0;
      }
      else {
        in_stack_fffffffffffff3b0 =
             __dynamic_cast(in_stack_fffffffffffff3b8,&amrex::AmrLevel::typeinfo,
                            &NavierStokesBase::typeinfo,0);
      }
      local_350 = in_stack_fffffffffffff3b0;
      NavierStokesBase::getDivCond
                (in_stack_fffffffffffff2f0,(int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),
                 (Real)in_stack_fffffffffffff2e0);
      std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
      unique_ptr<std::default_delete<amrex::MultiFab>,void>
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff270,(pointer)in_stack_fffffffffffff268);
      NavierStokesBase::getDivCond
                (in_stack_fffffffffffff2f0,(int)((ulong)in_stack_fffffffffffff2e8 >> 0x20),
                 (Real)in_stack_fffffffffffff2e0);
      std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
      unique_ptr<std::default_delete<amrex::MultiFab>,void>
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff270,(pointer)in_stack_fffffffffffff268);
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                 SUB41((uint)in_stack_fffffffffffff294 >> 0x18,0));
      while (bVar1 = amrex::MFIter::isValid(&local_3c0), bVar1) {
        amrex::MFIter::growntilebox
                  ((MFIter *)in_stack_fffffffffffff2e0,
                   (int)((ulong)in_stack_fffffffffffff2d8 >> 0x20));
        local_3c8 = local_3e4;
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x831ec8);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                   (MFIter *)in_stack_fffffffffffff270);
        local_3f0 = local_430;
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x831efd);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                   (MFIter *)in_stack_fffffffffffff270);
        local_438 = local_478;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                   (MFIter *)in_stack_fffffffffffff270);
        local_480 = local_4c0;
        memcpy(local_588,local_3f0,0x3c);
        memcpy(auStack_548,local_438,0x3c);
        memcpy(auStack_508,local_480,0x3c);
        local_4c8 = local_238;
        amrex::
        ParallelFor<Projection::initialSyncProject(int,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>,double,double,int)::__0>
                  ((Box *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                   in_stack_fffffffffffff2b0);
        amrex::MFIter::operator++(&local_3c0);
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff270);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff270);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff270);
    }
  }
  while (local_38 = iVar9, iVar9 = in_ESI, local_38 <= iVar2) {
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
               (int)((ulong)in_stack_fffffffffffff300 >> 0x20),(int)in_stack_fffffffffffff300);
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    local_590 = amrex::AmrLevel::get_old_data
                          ((AmrLevel *)in_stack_fffffffffffff270,
                           (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
    amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff310,in_stack_fffffffffffff308,
               (int)((ulong)in_stack_fffffffffffff300 >> 0x20),(int)in_stack_fffffffffffff300);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff270,
               (value_type)in_stack_fffffffffffff268);
    iVar9 = local_38 + 1;
  }
  while (local_38 = iVar9, local_38 <= iVar2) {
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    local_598 = amrex::AmrLevel::get_old_data
                          ((AmrLevel *)in_stack_fffffffffffff270,
                           (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    local_5a0 = amrex::AmrLevel::get_new_data
                          ((AmrLevel *)in_stack_fffffffffffff270,
                           (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::AmrLevel::get_state_data
              ((AmrLevel *)in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20)
              );
    local_5a8 = amrex::StateData::prevTime((StateData *)in_stack_fffffffffffff280);
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::AmrLevel::get_state_data
              ((AmrLevel *)in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20)
              );
    local_5b0 = amrex::StateData::curTime
                          ((StateData *)
                           CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290));
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
               (uchar)((uint)in_stack_fffffffffffff294 >> 0x18));
    while (bVar1 = amrex::MFIter::isValid(&local_610), bVar1) {
      ppAVar6 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                          ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                           in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
      pAVar8 = *ppAVar6;
      pFVar5 = amrex::FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff270,
                          in_stack_fffffffffffff268);
      (*pAVar8->_vptr_AmrLevel[0x1e])(SUB84(local_5a8,0),pAVar8,pFVar5,0,0,0,3);
      ppAVar6 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                          ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                           in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
      pAVar8 = *ppAVar6;
      pFVar5 = amrex::FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff270,
                          in_stack_fffffffffffff268);
      (*pAVar8->_vptr_AmrLevel[0x1e])(SUB84(local_5b0,0),pAVar8,pFVar5,0,0,0,3);
      amrex::MFIter::operator++(&local_610);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff270);
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::AmrLevel::get_old_data
              ((AmrLevel *)in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20)
              );
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    ppAVar6 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                        ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::AmrLevel::boxArray(*ppAVar6);
    ConvertUnew(in_stack_fffffffffffff340,in_stack_fffffffffffff338,
                (MultiFab *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                in_stack_fffffffffffff328,in_stack_fffffffffffff320);
    iVar9 = local_38 + 1;
  }
  bVar1 = OutFlowBC::HasOutFlowBC(in_RDI->phys_bc);
  local_38 = in_ESI;
  if (((bVar1) && (in_ECX != 0)) && (do_outflow_bcs != 0)) {
    amrex::GetVecOfPtrs<amrex::MultiFab>
              ((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
    in_stack_fffffffffffff270 =
         (Amr *)CONCAT44((int)((ulong)in_stack_fffffffffffff270 >> 0x20),iVar2);
    in_stack_fffffffffffff268 =
         (MFIter *)CONCAT44((int)((ulong)in_stack_fffffffffffff268 >> 0x20),in_ESI);
    in_stack_fffffffffffff278 = in_ECX;
    set_outflow_bcs(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                    in_stack_00000030,in_stack_00000038,in_stack_00000040);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x8324f1);
  }
  for (; iVar9 = iVar2, local_38 <= iVar2; local_38 = local_38 + 1) {
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    scaleVar(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,
             (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20),(MultiFab *)in_stack_fffffffffffff3b8,
             (int)((ulong)in_stack_fffffffffffff3b0 >> 0x20));
    if (in_ECX != 0) {
      this_00 = amrex::AmrMesh::Geom
                          ((AmrMesh *)in_stack_fffffffffffff270,
                           (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
      bVar1 = amrex::CoordSys::IsRZ(&this_00->super_CoordSys);
      if (bVar1) {
        iVar9 = local_38;
        amrex::
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
        mf = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                       ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                        in_stack_fffffffffffff270);
        radMultScal(in_RDI,iVar9,mf);
      }
    }
  }
  while (local_38 = iVar9, in_ESI + 1 <= local_38) {
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::FabArrayBase::boxArray((FabArrayBase *)*ppMVar4);
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::FabArrayBase::boxArray((FabArrayBase *)*ppMVar4);
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar4);
    ppMVar4 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar4);
    local_7f8[4] = 0;
    local_7f8[5] = 0;
    local_7f8[6] = 0;
    local_7f8[7] = 0;
    local_7f8[0] = 0;
    local_7f8[1] = 0;
    local_7f8[2] = 0;
    local_7f8[3] = 0;
    local_7f8._32_8_ = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x832748);
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    i = amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff270);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
               (DistributionMapping *)in_stack_fffffffffffff2a0,
               (int)((ulong)in_stack_fffffffffffff298 >> 0x20),(int)in_stack_fffffffffffff298,
               (MFInfo *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
               in_stack_fffffffffffff2c0);
    amrex::MFInfo::~MFInfo((MFInfo *)0x8327b5);
    local_9d8[0].inv_dx[1] = 0.0;
    local_9d8[0].inv_dx[2] = 0.0;
    local_9d8[0].dx[2] = 0.0;
    local_9d8[0].inv_dx[0] = 0.0;
    local_9d8[0].ok = false;
    local_9d8[0]._81_7_ = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x832809);
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff270,(size_type)i);
    in_stack_fffffffffffff268 =
         (MFIter *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff270);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
               (DistributionMapping *)in_stack_fffffffffffff2a0,
               (int)((ulong)in_stack_fffffffffffff298 >> 0x20),(int)in_stack_fffffffffffff298,
               (MFInfo *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
               in_stack_fffffffffffff2c0);
    amrex::MFInfo::~MFInfo((MFInfo *)0x832872);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_fffffffffffff2a0,(MultiFab *)in_stack_fffffffffffff298,
               in_stack_fffffffffffff294,in_stack_fffffffffffff290,
               (int)((ulong)in_stack_fffffffffffff288 >> 0x20),(int)in_stack_fffffffffffff288);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_fffffffffffff2a0,(MultiFab *)in_stack_fffffffffffff298,
               in_stack_fffffffffffff294,in_stack_fffffffffffff290,
               (int)((ulong)in_stack_fffffffffffff288 >> 0x20),(int)in_stack_fffffffffffff288);
    ppAVar6 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                        ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                         in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    if (*ppAVar6 == (AmrLevel *)0x0) {
      local_9d8[0].dx[1] = 0.0;
    }
    else {
      local_9d8[0].dx[1] =
           (Real)__dynamic_cast(*ppAVar6,&amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
    }
    in_stack_fffffffffffff2e0 = (Print *)(local_7f8 + 10);
    amrex::FabArrayBase::nComp((FabArrayBase *)in_stack_fffffffffffff2e0);
    NavierStokesBase::average_down
              (in_stack_fffffffffffff280,
               (MultiFab *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
               (MultiFab *)in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20)
               ,(int)in_stack_fffffffffffff268);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_fffffffffffff2a0,(MultiFab *)in_stack_fffffffffffff298,
               in_stack_fffffffffffff294,in_stack_fffffffffffff290,
               (int)((ulong)in_stack_fffffffffffff288 >> 0x20),(int)in_stack_fffffffffffff288);
    amrex::MultiFab::~MultiFab((MultiFab *)0x832a53);
    amrex::MultiFab::~MultiFab((MultiFab *)0x832a60);
    iVar9 = local_38 + -1;
  }
  local_38 = in_ESI;
  if (in_ECX != 0) {
    for (; local_38 <= iVar2; local_38 = local_38 + 1) {
      amrex::
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x832acd);
      amrex::MultiFab::mult
                ((MultiFab *)in_stack_fffffffffffff280,
                 (Real)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                 (int)((ulong)in_stack_fffffffffffff270 >> 0x20),(int)in_stack_fffffffffffff270,
                 (int)((ulong)in_stack_fffffffffffff268 >> 0x20));
    }
  }
  local_9d8[0].dx[0]._7_1_ = 1;
  amrex::GetVecOfPtrs<amrex::MultiFab>
            ((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
  local_9e8 = (_func_int **)0x0;
  uStack_9e0._0_4_ = 0;
  uStack_9e0._4_4_ = 0;
  local_9d8[0].c_sys = cartesian;
  local_9d8[0]._4_4_ = 0;
  pAVar8 = (AmrLevel *)&local_9e8;
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x832b61);
  uVar7 = local_9d8[0].dx[0]._7_1_ & 1;
  x = local_9d8[0].offset;
  pMVar3 = (MultiFab *)0x0;
  doMLMGNodalProjection
            (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
             in_stack_fffffffffffff950,in_stack_fffffffffffff958,in_stack_fffffffffffff888,
             in_stack_fffffffffffff880,(bool)in_stack_fffffffffffff87f,in_stack_fffffffffffff968,
             in_stack_fffffffffffff970,(bool)in_stack_fffffffffffff87e);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x832bec);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x832bf9);
  for (local_38 = in_ESI; iVar9 = in_ESI, local_38 <= iVar2; local_38 = local_38 + 1) {
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pAVar8,(size_type)x)
    ;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pAVar8,(size_type)x)
    ;
    rescaleVar(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,
               (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20),(MultiFab *)in_stack_fffffffffffff3b8
               ,(int)((ulong)in_stack_fffffffffffff3b0 >> 0x20));
  }
  while (local_38 = iVar9, local_38 <= iVar2) {
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)pAVar8,(size_type)x)
    ;
    local_9f0 = amrex::AmrLevel::get_new_data(pAVar8,(int)((ulong)x >> 0x20));
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pAVar8,(size_type)x)
    ;
    amrex::MultiFab::Add
              (pMVar3,(MultiFab *)CONCAT44(in_stack_fffffffffffff27c,uVar7),
               (int)((ulong)pAVar8 >> 0x20),(int)pAVar8,(int)((ulong)x >> 0x20),(int)x);
    iVar9 = local_38 + 1;
  }
  if (verbose != 0) {
    local_9f4 = amrex::ParallelDescriptor::IOProcessorNumber();
    local_a00 = amrex::ParallelDescriptor::second();
    local_a00 = local_a00 - local_1e0;
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_a00,local_9f4);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff2a0,(ostream *)in_stack_fffffffffffff298);
    amrex::Print::operator<<((Print *)pAVar8,(char (*) [41])x);
    amrex::Print::operator<<((Print *)pAVar8,x);
    amrex::Print::operator<<((Print *)pAVar8,(char *)x);
    amrex::Print::~Print(in_stack_fffffffffffff2e0);
  }
  amrex::
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~Vector((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             *)0x832e5b);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x832e68);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x832e75);
  return;
}

Assistant:

void
Projection::initialSyncProject (int       c_lev,
                                const Vector<MultiFab*> sig,
                                Real      dt,
                                Real      strt_time,
                                int       have_divu)
{
    int lev;
    int f_lev = parent->finestLevel();

    if (verbose)
      amrex::Print() << "Projection::initialSyncProject(): levels = " << c_lev << " - " << f_lev << '\n';

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real stime = ParallelDescriptor::second();

    //
    // Gather data.
    //
    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);

    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
        // phi points to P_old and we use it as a temporary to
        // store phi resulting from the nodal projection, AKA
        // the pressure increment
        phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));
        phi[lev] -> setVal(0.0);
    }

    const Real dt_inv = 1./dt;

    //
    // Source term
    //
    Vector<std::unique_ptr<MultiFab> > rhcc;
    if (have_divu)
    {
        rhcc.resize(maxlev);

        //
        // Set up rhcc for manual project.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            AmrLevel& amr_level = parent->getLevel(lev);

            int Divu_Type, Divu;
            if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
                amrex::Error("Projection::initialSyncProject(): Divu not found");
            //
            // Make sure ghost cells are properly filled.
            //
            MultiFab& divu_new = amr_level.get_new_data(Divu_Type);
            MultiFab& divu_old = amr_level.get_old_data(Divu_Type);
            divu_new.FillBoundary();
            divu_old.FillBoundary();

            Real prev_time = amr_level.get_state_data(Divu_Type).prevTime();
            Real curr_time = amr_level.get_state_data(Divu_Type).curTime();

            for (MFIter mfi(divu_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(divu_old[mfi],Divu_Type,prev_time,0,0,1);
                amr_level.setPhysBoundaryValues(divu_new[mfi],Divu_Type,curr_time,0,0,1);
            }

	    // Needed for set_outflow_bcs(). MLMG ignores rh ghost cells.
            const int nghost = 1;
            rhcc[lev].reset(new MultiFab(amr_level.boxArray(),
                            amr_level.DistributionMap(),
                            1,nghost,MFInfo(),amr_level.Factory()));
            MultiFab* rhcclev = rhcc[lev].get();
            rhcclev->setVal(0);

            NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(&parent->getLevel(lev));

            AMREX_ASSERT(!(ns == 0));

            std::unique_ptr<MultiFab> divu (ns->getDivCond(nghost,strt_time));
            std::unique_ptr<MultiFab> dsdt (ns->getDivCond(nghost,strt_time+dt));

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*rhcclev,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
               const Box& bx = mfi.growntilebox();
               const auto& du       = divu->array(mfi);
               const auto& dsdt_arr = dsdt->array(mfi);
               const auto& rhcc_arr = rhcclev->array(mfi);
               amrex::ParallelFor(bx, [du,dsdt_arr,rhcc_arr,dt_inv]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  rhcc_arr(i,j,k) = ( dsdt_arr(i,j,k) - du(i,j,k) ) * dt_inv;
               });
            }
        }
    }

    //
    // Set velocity bndry values to bogus values.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        MultiFab &u_o = LevelData[lev]->get_old_data(State_Type);
        u_o.setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        sig[lev]->setBndry(BogusValue);
    }

    //
    // Convert velocities to accelerations (we always do this for the
    //  projections in these initial iterations).
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& S_old = LevelData[lev]->get_old_data(State_Type);
        MultiFab& S_new = LevelData[lev]->get_new_data(State_Type);

        Real prev_time = LevelData[lev]->get_state_data(State_Type).prevTime();
        Real curr_time = LevelData[lev]->get_state_data(State_Type).curTime();

        for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
        {
            LevelData[lev]->setPhysBoundaryValues(S_old[mfi],State_Type,prev_time,Xvel,Xvel,AMREX_SPACEDIM);
            LevelData[lev]->setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
        }

        MultiFab& u_o = LevelData[lev]->get_old_data(State_Type);
        ConvertUnew(*vel[lev], u_o, dt, LevelData[lev]->boxArray());
    }

    if (OutFlowBC::HasOutFlowBC(phys_bc) && have_divu && do_outflow_bcs) {
        set_outflow_bcs(INITIAL_SYNC,phi,vel,
                        amrex::GetVecOfPtrs(rhcc),
                        sig,c_lev,f_lev,have_divu);
    }

    //
    // Scale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        scaleVar(sig[lev],1,vel[lev],lev);

        if (have_divu && parent->Geom(0).IsRZ())
          radMultScal(lev,*(rhcc[lev]));
    }

    for (lev = f_lev; lev >= c_lev+1; lev--) {
      const BoxArray& crse_grids = vel[lev-1]->boxArray();
      const BoxArray& fine_grids = vel[lev  ]->boxArray();
      const DistributionMapping& crse_dmap = vel[lev-1]->DistributionMap();
      const DistributionMapping& fine_dmap = vel[lev  ]->DistributionMap();

      MultiFab v_crse(crse_grids, crse_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev-1]->Factory());
      MultiFab v_fine(fine_grids, fine_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev]->Factory());

      MultiFab::Copy(v_crse, *vel[lev-1], 0, 0, AMREX_SPACEDIM, 1);
      MultiFab::Copy(v_fine, *vel[lev  ], 0, 0, AMREX_SPACEDIM, 1);

      NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev-1]);
      ns->average_down(v_fine, v_crse, 0, v_crse.nComp());

      MultiFab::Copy(*vel[lev-1], v_crse, 0, 0, AMREX_SPACEDIM, 1);
    }

    //
    // Project.
    //
    if (have_divu) {
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            rhcc[lev]->mult(-1.0,0,1);
        }
    }

    bool increment_gp = true;
    doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi, sig,
                          amrex::GetVecOfPtrs(rhcc),
                          {}, proj_tol, proj_abs_tol, increment_gp, 0, 0);

    //
    // Unscale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
        rescaleVar(sig[lev],1,vel[lev],lev);

    //
    // Add correction at coarse and fine levels.
    // Only update new. NSB::resetState will take care of setting
    // old = new
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& P_new = LevelData[lev]->get_new_data(Press_Type);
        MultiFab::Add(P_new, *phi[lev], 0, 0, 1, 1);
    }

    //
    // Grad(P_new) incremented in doMLMGNodalProjection.
    //

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - stime;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "Projection::initialSyncProject(): time: " << run_time << '\n';
    }
}